

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

LY_ERR xpath_concat(lyxp_set **args,uint32_t arg_count,lyxp_set *set,uint32_t options)

{
  int iVar1;
  lyxp_set *plVar2;
  ushort *puVar3;
  ly_bool lVar4;
  LY_ERR LVar5;
  char *pcVar6;
  size_t sVar7;
  lyxp_set_node *__ptr;
  uint uVar8;
  char *format;
  long lVar9;
  undefined4 uVar10;
  ly_ctx *ctx;
  ulong uVar11;
  
  if ((options & 0x1c) == 0) {
    if (arg_count == 0) {
      __ptr = (lyxp_set_node *)0x0;
    }
    else {
      lVar9 = 1;
      uVar11 = 0;
      __ptr = (lyxp_set_node *)0x0;
      do {
        LVar5 = lyxp_set_cast(args[uVar11],LYXP_SET_STRING);
        if (LVar5 != LY_SUCCESS) {
          free(__ptr);
          return LVar5;
        }
        sVar7 = strlen((args[uVar11]->val).str);
        __ptr = (lyxp_set_node *)ly_realloc(__ptr,sVar7 + lVar9);
        if (__ptr == (lyxp_set_node *)0x0) {
          ly_log(set->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","xpath_concat");
          return LY_EMEM;
        }
        strcpy((char *)((long)__ptr + lVar9 + -1),(args[uVar11]->val).str);
        sVar7 = strlen((args[uVar11]->val).str);
        lVar9 = lVar9 + sVar7;
        uVar11 = uVar11 + 1;
      } while (arg_count != uVar11);
    }
    lyxp_set_free_content(set);
    set->type = LYXP_SET_STRING;
    (set->val).nodes = __ptr;
  }
  else {
    if (arg_count != 0) {
      uVar11 = 0;
      do {
        plVar2 = args[uVar11];
        if (plVar2->type == LYXP_SET_SCNODE_SET) {
          uVar8 = plVar2->used;
          do {
            uVar8 = uVar8 - 1;
            if (*(int *)((long)(plVar2->val).nodes + (ulong)uVar8 * 0x18 + 0xc) == 2) {
              puVar3 = *(ushort **)((long)(plVar2->val).nodes + (ulong)uVar8 * 0x18);
              if (puVar3 == (ushort *)0x0) break;
              if ((*puVar3 & 0xc) == 0) {
                ctx = set->ctx;
                pcVar6 = lys_nodetype2str(*puVar3);
                format = "Argument #%u of %s is a %s node \"%s\".";
              }
              else {
                lVar4 = warn_is_string_type(*(lysc_type **)(puVar3 + 0x30));
                if (lVar4 != '\0') break;
                ctx = set->ctx;
                format = "Argument #%u of %s is node \"%s\", not of string-type.";
                pcVar6 = *(char **)(puVar3 + 0x14);
              }
              ly_log(ctx,LY_LLWRN,LY_SUCCESS,format,(ulong)((int)uVar11 + 1),"xpath_concat",pcVar6);
              break;
            }
          } while (uVar8 != 0);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != arg_count);
    }
    uVar8 = set->used;
    if ((ulong)uVar8 != 0) {
      lVar9 = 0;
      do {
        iVar1 = *(int *)((long)&((set->val).nodes)->pos + lVar9);
        if (iVar1 == 2) {
          uVar10 = 1;
LAB_001b0c78:
          *(undefined4 *)((long)&((set->val).nodes)->pos + lVar9) = uVar10;
        }
        else if (iVar1 == -2) {
          uVar10 = 0xffffffff;
          goto LAB_001b0c78;
        }
        lVar9 = lVar9 + 0x18;
      } while ((ulong)uVar8 * 0x18 != lVar9);
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
xpath_concat(struct lyxp_set **args, uint32_t arg_count, struct lyxp_set *set, uint32_t options)
{
    uint32_t i;
    char *str = NULL;
    size_t used = 1;
    LY_ERR rc = LY_SUCCESS;
    struct lysc_node_leaf *sleaf;

    if (options & LYXP_SCNODE_ALL) {
        for (i = 0; i < arg_count; ++i) {
            if ((args[i]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[i]))) {
                if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                    LOGWRN(set->ctx, "Argument #%" PRIu32 " of %s is a %s node \"%s\".",
                            i + 1, __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
                } else if (!warn_is_string_type(sleaf->type)) {
                    LOGWRN(set->ctx, "Argument #%" PRIu32 " of %s is node \"%s\", not of string-type.", i + 1, __func__,
                            sleaf->name);
                }
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    for (i = 0; i < arg_count; ++i) {
        rc = lyxp_set_cast(args[i], LYXP_SET_STRING);
        if (rc != LY_SUCCESS) {
            free(str);
            return rc;
        }

        str = ly_realloc(str, (used + strlen(args[i]->val.str)) * sizeof(char));
        LY_CHECK_ERR_RET(!str, LOGMEM(set->ctx), LY_EMEM);
        strcpy(str + used - 1, args[i]->val.str);
        used += strlen(args[i]->val.str);
    }

    /* free, kind of */
    lyxp_set_free_content(set);
    set->type = LYXP_SET_STRING;
    set->val.str = str;

    return LY_SUCCESS;
}